

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::BamStandardIndex::GetOffset
          (BamStandardIndex *this,BamRegion *region,int64_t *offset,bool *hasAlignmentsInRegion)

{
  bool bVar1;
  size_type sVar2;
  undefined8 uVar3;
  BamAlignment *this_00;
  iterator this_01;
  difference_type dVar4;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> *p_Var5;
  reference plVar6;
  pointer in_RCX;
  long *in_RDX;
  int *in_RSI;
  BamAlignment *in_RDI;
  string message;
  string readerError;
  int64_t *candidateOffset;
  difference_type step;
  difference_type count;
  OffsetConstIterator offsetLast;
  OffsetConstIterator offsetIter;
  OffsetConstIterator offsetFirst;
  BamAlignment al;
  vector<long,_std::allocator<long>_> offsets;
  uint64_t *minOffset;
  set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> candidateBins;
  uint32_t end;
  uint32_t begin;
  BaiReferenceSummary *refSummary;
  BamReaderPrivate *in_stack_fffffffffffffc58;
  int in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc64;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
  in_stack_fffffffffffffc68;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
  in_stack_fffffffffffffc70;
  allocator *paVar7;
  undefined6 in_stack_fffffffffffffc78;
  undefined1 in_stack_fffffffffffffc7e;
  undefined1 in_stack_fffffffffffffc7f;
  BamAlignment *this_02;
  string *in_stack_fffffffffffffc90;
  string *message_00;
  string *in_stack_fffffffffffffc98;
  string *where;
  BamException *in_stack_fffffffffffffca0;
  char *__lhs;
  vector<long,_std::allocator<long>_> *in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd8;
  int iVar8;
  BamReaderPrivate *in_stack_fffffffffffffce8;
  undefined6 in_stack_fffffffffffffcf0;
  undefined1 in_stack_fffffffffffffcf6;
  allocator in_stack_fffffffffffffcf7;
  uint32_t *in_stack_fffffffffffffcf8;
  BamStandardIndex *in_stack_fffffffffffffd00;
  long local_288;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> position;
  long *local_260;
  undefined1 local_e8 [92];
  char local_8c [18];
  undefined1 local_7a;
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [32];
  pointer local_20;
  long *local_18;
  int *local_10;
  
  if (-1 < *in_RSI) {
    iVar8 = *in_RSI;
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    sVar2 = std::
            vector<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
            ::size((vector<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
                    *)&(in_RDI->QueryBases).field_2);
    if (iVar8 < (int)sVar2) {
      local_8c._4_8_ =
           std::
           vector<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
           ::at((vector<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
                 *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                (size_type)in_stack_fffffffffffffc58);
      __lhs = local_e8 + 0x5c;
      AdjustRegion((BamStandardIndex *)
                   CONCAT17(in_stack_fffffffffffffcf7,
                            CONCAT16(in_stack_fffffffffffffcf6,in_stack_fffffffffffffcf0)),
                   (BamRegion *)in_stack_fffffffffffffce8,(uint32_t *)in_RDI,
                   (uint32_t *)CONCAT44(iVar8,in_stack_fffffffffffffcd8));
      std::set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>::set
                ((set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> *)
                 0x1b73fe);
      CalculateCandidateBins
                (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                 (uint32_t *)
                 CONCAT17(in_stack_fffffffffffffcf7,
                          CONCAT16(in_stack_fffffffffffffcf6,in_stack_fffffffffffffcf0)),
                 (set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> *)
                 in_stack_fffffffffffffce8);
      this_00 = (BamAlignment *)
                CalculateMinOffset((BamStandardIndex *)
                                   CONCAT17(in_stack_fffffffffffffc7f,
                                            CONCAT16(in_stack_fffffffffffffc7e,
                                                     in_stack_fffffffffffffc78)),
                                   (BaiReferenceSummary *)in_stack_fffffffffffffc70._M_current,
                                   (uint32_t *)in_stack_fffffffffffffc68._M_current);
      local_e8._32_8_ = local_e8 + 0x18;
      where = (string *)local_e8;
      local_e8._24_8_ = this_00;
      std::vector<long,_std::allocator<long>_>::vector
                ((vector<long,_std::allocator<long>_> *)0x1b746f);
      CalculateCandidateOffsets
                ((BamStandardIndex *)
                 CONCAT17(in_stack_fffffffffffffcf7,
                          CONCAT16(in_stack_fffffffffffffcf6,in_stack_fffffffffffffcf0)),
                 (BaiReferenceSummary *)in_stack_fffffffffffffce8,(uint64_t *)in_RDI,
                 (set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> *)
                 CONCAT44(iVar8,in_stack_fffffffffffffcd8),in_stack_fffffffffffffcd0);
      bVar1 = std::vector<long,_std::allocator<long>_>::empty
                        ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffc70._M_current
                        );
      if (!bVar1) {
        message_00 = (string *)local_e8;
        std::vector<long,_std::allocator<long>_>::begin
                  ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffc58);
        std::vector<long,_std::allocator<long>_>::end
                  ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffc58);
        std::sort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>
                  ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
                   in_stack_fffffffffffffc70._M_current,
                   (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
                   in_stack_fffffffffffffc68._M_current);
        BamAlignment::BamAlignment(this_00);
        this_02 = (BamAlignment *)local_e8;
        this_01 = std::vector<long,_std::allocator<long>_>::begin
                            ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffc58);
        __gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>::
        __normal_iterator<long*>
                  ((__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> *)
                   CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                   (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                   in_stack_fffffffffffffc58);
        std::vector<long,_std::allocator<long>_>::end
                  ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffc58);
        __gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>::
        __normal_iterator<long*>
                  ((__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> *)
                   CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                   (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                   in_stack_fffffffffffffc58);
        dVar4 = std::
                distance<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>>
                          (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
        while (local_288 = dVar4, 0 < local_288) {
          position._M_current = local_260;
          std::
          advance<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>,long>
                    ((__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> *)
                     this_02,CONCAT17(in_stack_fffffffffffffc7f,
                                      CONCAT16(in_stack_fffffffffffffc7e,in_stack_fffffffffffffc78))
                    );
          __gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::
          operator*((__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> *)
                    &stack0xfffffffffffffd90);
          in_stack_fffffffffffffc7f =
               BamReaderPrivate::Seek((BamReaderPrivate *)this_01._M_current,position._M_current);
          if (!(bool)in_stack_fffffffffffffc7f) {
            BamReaderPrivate::GetErrorString_abi_cxx11_(in_stack_fffffffffffffc58);
            std::operator+(__lhs,&this_00->Name);
            uVar3 = __cxa_allocate_exception(0x28);
            paVar7 = (allocator *)&stack0xfffffffffffffcf7;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&stack0xfffffffffffffcf8,"BamToolsIndex::GetOffset",paVar7);
            BamException::BamException((BamException *)this_00,where,message_00);
            __cxa_throw(uVar3,&BamException::typeinfo,BamException::~BamException);
          }
          bVar1 = BamReaderPrivate::LoadNextAlignment(in_stack_fffffffffffffce8,in_RDI);
          in_stack_fffffffffffffc64 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffc64);
          local_20->Type = bVar1;
          in_stack_fffffffffffffc60 =
               BamAlignment::GetEndPosition
                         (this_02,(bool)in_stack_fffffffffffffc7f,(bool)in_stack_fffffffffffffc7e);
          dVar4 = local_288 / 2;
          if (in_stack_fffffffffffffc60 <= local_10[1]) {
            p_Var5 = __gnu_cxx::
                     __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::
                     operator++((__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
                                 *)&stack0xfffffffffffffd90);
            local_260 = p_Var5->_M_current;
            dVar4 = local_288 - (local_288 / 2 + 1);
          }
        }
        std::vector<long,_std::allocator<long>_>::begin
                  ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffc58);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
                            *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                           (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                           in_stack_fffffffffffffc58);
        if (bVar1) {
          __gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::
          operator--((__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> *)
                     &stack0xfffffffffffffd90);
        }
        plVar6 = __gnu_cxx::
                 __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::
                 operator*((__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
                            *)&stack0xfffffffffffffd90);
        *local_18 = *plVar6;
        BamAlignment::~BamAlignment
                  ((BamAlignment *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
      }
      std::vector<long,_std::allocator<long>_>::~vector
                ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffc70._M_current);
      std::set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>::~set
                ((set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> *)
                 0x1b791f);
      return;
    }
  }
  local_7a = 1;
  uVar3 = __cxa_allocate_exception(0x28);
  paVar7 = &local_41;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"BamStandardIndex::GetOffset",paVar7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_78,"invalid reference ID requested",(allocator *)(local_e8 + 0x6f));
  BamException::BamException
            (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
  local_7a = 0;
  __cxa_throw(uVar3,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamStandardIndex::GetOffset(const BamRegion& region, int64_t& offset, bool* hasAlignmentsInRegion) {

    // cannot calculate offsets if unknown/invalid reference ID requested
    if ( region.LeftRefID < 0 || region.LeftRefID >= (int)m_indexFileSummary.size() )
        throw BamException("BamStandardIndex::GetOffset", "invalid reference ID requested");

    // retrieve index summary for left bound reference
    const BaiReferenceSummary& refSummary = m_indexFileSummary.at(region.LeftRefID);

    // set up region boundaries based on actual BamReader data
    uint32_t begin;
    uint32_t end;
    AdjustRegion(region, begin, end);

    // retrieve all candidate bin IDs for region
    set<uint16_t> candidateBins;
    CalculateCandidateBins(begin, end, candidateBins);

    // use reference's linear offsets to calculate the minimum offset
    // that must be considered to find overlap
    const uint64_t& minOffset = CalculateMinOffset(refSummary, begin);

    // attempt to use reference summary, minOffset, & candidateBins to calculate offsets
    // no data should not be error, just bail
    vector<int64_t> offsets;
    CalculateCandidateOffsets(refSummary, minOffset, candidateBins, offsets);
    if ( offsets.empty() )
        return;
    
    // ensure that offsets are sorted before processing
    sort( offsets.begin(), offsets.end() );

    // binary search for an overlapping block (may not be first one though)
    BamAlignment al;
    typedef vector<int64_t>::const_iterator OffsetConstIterator;
    OffsetConstIterator offsetFirst = offsets.begin();
    OffsetConstIterator offsetIter  = offsetFirst;
    OffsetConstIterator offsetLast  = offsets.end();
    iterator_traits<OffsetConstIterator>::difference_type count = distance(offsetFirst, offsetLast);
    iterator_traits<OffsetConstIterator>::difference_type step;
    while ( count > 0 ) {
        offsetIter = offsetFirst;
        step = count/2;
        advance(offsetIter, step);

        // attempt seek to candidate offset
        const int64_t& candidateOffset = (*offsetIter);
        if ( !m_reader->Seek(candidateOffset) ) {
            const string readerError = m_reader->GetErrorString();
            const string message = "could not seek in BAM file: \n\t" + readerError;
            throw BamException("BamToolsIndex::GetOffset", message);
        }

        // load first available alignment, setting flag to true if data exists
        *hasAlignmentsInRegion = m_reader->LoadNextAlignment(al);

        // check alignment against region
        if ( al.GetEndPosition() <= region.LeftPosition ) {
            offsetFirst = ++offsetIter;
            count -= step+1;
        } else count = step;
    }

    // step back to the offset before the 'current offset' (to make sure we cover overlaps)
    if ( offsetIter != offsets.begin() )
        --offsetIter;
    offset = (*offsetIter);
}